

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RigidBody.cpp
# Opt level: O0

void __thiscall OpenMD::RigidBody::setA(RigidBody *this,RotMat3x3d *a)

{
  bool bVar1;
  Snapshot *pSVar2;
  ulong uVar3;
  size_type sVar4;
  reference ppAVar5;
  long in_RDI;
  uint i;
  SquareMatrix3<double> *in_stack_ffffffffffffff18;
  SquareMatrix3<double> *in_stack_ffffffffffffff20;
  value_type pAVar6;
  SquareMatrix3<double> *in_stack_ffffffffffffff48;
  SquareMatrix3<double> *in_stack_ffffffffffffff50;
  SquareMatrix3<double> *in_stack_ffffffffffffff58;
  undefined1 local_60 [76];
  uint local_14;
  
  pSVar2 = SnapshotManager::getCurrentSnapshot(*(SnapshotManager **)(in_RDI + 0x18));
  std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
  operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
              *)((long)&(pSVar2->atomData).aMat.
                        super__Vector_base<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start + *(long *)(in_RDI + 0x10)),
             (long)*(int *)(in_RDI + 0x30));
  SquareMatrix3<double>::operator=(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  for (local_14 = 0; uVar3 = (ulong)local_14,
      sVar4 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::size
                        ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128)
                        ), uVar3 < sVar4; local_14 = local_14 + 1) {
    std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
              ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)(in_RDI + 0x128),
               (ulong)local_14);
    bVar1 = Atom::isDirectional((Atom *)0x27ec9b);
    if (bVar1) {
      ppAVar5 = std::vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>::operator[]
                          ((vector<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_> *)
                           (in_RDI + 0x128),(ulong)local_14);
      pAVar6 = *ppAVar5;
      std::vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>::
      operator[]((vector<OpenMD::SquareMatrix3<double>,_std::allocator<OpenMD::SquareMatrix3<double>_>_>
                  *)(in_RDI + 0x170),(ulong)local_14);
      SquareMatrix3<double>::transpose(in_stack_ffffffffffffff48);
      OpenMD::operator*(in_stack_ffffffffffffff58,in_stack_ffffffffffffff50);
      (*(pAVar6->super_StuntDouble)._vptr_StuntDouble[3])(pAVar6,local_60);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27ed33);
      SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x27ed3d);
    }
  }
  return;
}

Assistant:

void RigidBody::setA(const RotMat3x3d& a) {
    ((snapshotMan_->getCurrentSnapshot())->*storage_).aMat[localIndex_] = a;

    for (unsigned int i = 0; i < atoms_.size(); ++i) {
      if (atoms_[i]->isDirectional()) {
        atoms_[i]->setA(refOrients_[i].transpose() * a);
      }
    }
  }